

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O2

int lib::string::Sub(State *state)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  String *pSVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  StackAPI api;
  string sub;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar2 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    (&api,2,ValueT_String,ValueT_Number,ValueT_Number);
  iVar7 = 0;
  if (bVar2) {
    pSVar5 = luna::StackAPI::GetString(&api,0);
    uVar1 = pSVar5->length_;
    iVar7 = 1;
    dVar10 = luna::StackAPI::GetNumber(&api,1);
    iVar8 = (int)dVar10;
    iVar3 = luna::StackAPI::GetStackSize(&api);
    uVar6 = uVar1;
    if (iVar3 < 3) {
      if (iVar8 == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = iVar8;
        if (iVar8 < 0) {
          iVar3 = 1;
          if (-1 < (int)(uVar1 + iVar8)) {
            iVar3 = uVar1 + 1 + iVar8;
          }
        }
      }
    }
    else {
      iVar3 = -iVar8;
      if (0 < iVar8) {
        iVar3 = iVar8;
      }
      if (iVar8 == 0) {
        iVar3 = iVar7;
      }
      dVar10 = luna::StackAPI::GetNumber(&api,2);
      uVar4 = (uint)dVar10;
      uVar6 = -uVar4;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      if ((int)uVar1 < (int)uVar6) {
        uVar6 = uVar1;
      }
    }
    sub._M_dataplus._M_p = (pointer)&sub.field_2;
    sub._M_string_length = 0;
    sub.field_2._M_local_buf[0] = '\0';
    for (lVar9 = (long)iVar3; lVar9 <= (int)uVar6; lVar9 = lVar9 + 1) {
      std::__cxx11::string::push_back((char)&sub);
    }
    luna::StackAPI::PushString(&api,&sub);
    std::__cxx11::string::~string((string *)&sub);
  }
  return iVar7;
}

Assistant:

int Sub(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_String,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto str = api.GetString(0);
        int size = str->GetLength();
        auto c_str = str->GetCStr();
        auto start = static_cast<int>(api.GetNumber(1));
        auto end = size;

        auto params = api.GetStackSize();
        if (params <= 2)
        {
            if (start == 0)
            {
                start = 1;
            }
            else if (start < 0)
            {
                start += size;
                start = start < 0 ? 1 : start + 1;
            }
        }
        else
        {
            start = start == 0 ? 1 : std::abs(start);
            end = std::abs(static_cast<int>(api.GetNumber(2)));
            end = std::min(end, size);
        }

        std::string sub;
        for (int i = start; i <= end; ++i)
            sub.push_back(c_str[i - 1]);

        api.PushString(sub);
        return 1;
    }